

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSCrolling.h
# Opt level: O2

void __thiscall
chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
InjectConstraints(ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                  *this,ChSystemDescriptor *mdescriptor)

{
  ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::InjectConstraints
            (&this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>,
             mdescriptor);
  (*mdescriptor->_vptr_ChSystemDescriptor[3])(mdescriptor,&this->Rx);
  (*mdescriptor->_vptr_ChSystemDescriptor[3])(mdescriptor,&this->Ru);
  (*mdescriptor->_vptr_ChSystemDescriptor[3])(mdescriptor,&this->Rv);
  return;
}

Assistant:

virtual void InjectConstraints(ChSystemDescriptor& mdescriptor) override {
        // base behaviour too
        ChContactNSC<Ta, Tb>::InjectConstraints(mdescriptor);

        mdescriptor.InsertConstraint(&Rx);
        mdescriptor.InsertConstraint(&Ru);
        mdescriptor.InsertConstraint(&Rv);
    }